

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O2

stats_t * __thiscall
tchecker::algorithms::reach::algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_reach::graph_t>
::run(stats_t *__return_storage_ptr__,
     algorithm_t<tchecker::zg::zg_t,_tchecker::tck_reach::zg_reach::graph_t> *this,zg_t *ts,
     graph_t *graph,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,
     policy_t policy)

{
  pointer ptVar1;
  waiting_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>_>
  *waiting;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  pointer ptVar3;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  sst;
  graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
  local_40 [8];
  char local_38;
  
  waiting = tchecker::waiting::
            factory<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t>,unsigned_long,1ul>>>
                      (policy);
  stats_t::stats_t(__return_storage_ptr__);
  algorithms::stats_t::set_start_time(&__return_storage_ptr__->super_stats_t);
  sst.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sst.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sst.
  super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  zg::zg_t::initial(ts,&sst,1);
  ptVar1 = sst.
           super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar3 = sst.
                super__Vector_base<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
    tchecker::graph::reachability::
    graph_t<tchecker::tck_reach::zg_reach::node_t,tchecker::tck_reach::zg_reach::edge_t,tchecker::tck_reach::zg_reach::node_hash_t,tchecker::tck_reach::zg_reach::node_equal_to_t>
    ::
    add_node<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>&>
              (local_40,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                         *)graph);
    pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
             ::operator->((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
                           *)local_40);
    tchecker::graph::node_flags_t::initial
              (&(pmVar2->
                super_node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>
                ).super_node_t.super_node_flags_t,true);
    if (local_38 == '\x01') {
      (*waiting->_vptr_waiting_t[4])(waiting,local_40);
    }
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_reach::zg_reach::node_t,_tchecker::tck_reach::zg_reach::edge_t>,_unsigned_long,_1UL>_>
                *)local_40);
  }
  run_from_waiting(this,ts,graph,labels,waiting,__return_storage_ptr__);
  algorithms::stats_t::set_end_time(&__return_storage_ptr__->super_stats_t);
  std::
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>_>_>_>
  ::~vector(&sst);
  (*waiting->_vptr_waiting_t[1])(waiting);
  return __return_storage_ptr__;
}

Assistant:

tchecker::algorithms::reach::stats_t run(TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels,
                                           enum tchecker::waiting::policy_t policy)
  {
    std::unique_ptr<tchecker::waiting::waiting_t<node_sptr_t>> waiting{tchecker::waiting::factory<node_sptr_t>(policy)};

    tchecker::algorithms::reach::stats_t stats;

    stats.set_start_time();

    std::vector<typename TS::sst_t> sst;
    ts.initial(sst);
    for (auto && [status, s, t] : sst) {
      auto && [is_new_node, initial_node] = graph.add_node(s);
      initial_node->initial(true);
      if (is_new_node)
        waiting->insert(initial_node);
    }

    run_from_waiting(ts, graph, labels, *waiting, stats);

    stats.set_end_time();

    return stats;
  }